

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_16x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  fwd_transform_1d_sse4_1 p_Var1;
  int8_t *piVar2;
  int iVar3;
  int iVar4;
  byte in_CL;
  long in_RSI;
  int i_1;
  int i;
  int lr_flip;
  int ud_flip;
  int bit;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i out [32];
  __m128i in [32];
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  fwd_transform_1d_sse4_1 input_00;
  longlong local_428 [6];
  int in_stack_fffffffffffffc0c;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  __m128i *in_stack_fffffffffffffc18;
  __m128i *in_stack_fffffffffffffc20;
  longlong local_228 [66];
  byte local_15;
  long local_10;
  
  piVar2 = av1_fwd_txfm_shift_ls[8];
  local_15 = in_CL;
  local_10 = in_RSI;
  iVar3 = get_txw_idx('\b');
  iVar4 = get_txh_idx('\b');
  p_Var1 = col_highbd_txfm8x8_arr[local_15];
  input_00 = row_highbd_txfm8x16_arr[local_15];
  iVar3 = (int)av1_fwd_cos_bit_col[iVar3][iVar4];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffbb0,(int *)&stack0xfffffffffffffbac);
  for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
    load_buffer_8x8((int16_t *)input_00,(__m128i *)CONCAT44(iVar3,in_stack_fffffffffffffbb0),
                    in_stack_fffffffffffffbac,iVar4,in_stack_fffffffffffffba4,
                    in_stack_fffffffffffffba0);
    (*p_Var1)((__m128i *)local_228,(__m128i *)local_228,iVar3,2);
    col_txfm_8x8_rounding((__m128i *)local_228,-(int)piVar2[1]);
    transpose_8x8(in_stack_fffffffffffffc18,
                  (__m128i *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  }
  if (in_stack_fffffffffffffbac == 0) {
    (*input_00)((__m128i *)local_428,(__m128i *)local_428,iVar3,2);
  }
  else {
    flip_buf_sse4_1((__m128i *)local_228,(__m128i *)local_428,0x20);
    (*input_00)((__m128i *)local_228,(__m128i *)local_428,iVar3,2);
  }
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    av1_round_shift_rect_array_32_sse4_1
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
               in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
    write_buffer_8x8((__m128i *)local_228,(int32_t *)(local_10 + (long)(iVar3 << 6) * 4));
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    load_buffer_8x8(input + i * 8, in, stride, ud_flip, 0, shift[0]);
    col_txfm(in, in, bit, 2);
    col_txfm_8x8_rounding(in, -shift[1]);
    transpose_8x8(in, out + i * 16);
  }

  if (lr_flip) {
    flip_buf_sse4_1(in, out, 32);
    row_txfm(in, out, bit, 2);
  } else {
    row_txfm(out, out, bit, 2);
  }

  for (int i = 0; i < 2; i++) {
    av1_round_shift_rect_array_32_sse4_1(out + i * 16, in, 16, -shift[2],
                                         NewSqrt2);
    write_buffer_8x8(in, coeff + i * 64);
  }
  (void)bd;
}